

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O1

idx_t duckdb::LocateErrorIndex(bool is_append,ManagedSelection *matches)

{
  sel_t *psVar1;
  uint *puVar2;
  undefined7 in_register_00000039;
  idx_t iVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  if ((int)CONCAT71(in_register_00000039,is_append) == 0) {
    puVar2 = (matches->sel_vec).sel_vector;
    if (puVar2 == (uint *)0x0) {
      return 0;
    }
    return (ulong)*puVar2;
  }
  if (matches->size != 0) {
    psVar1 = (matches->sel_vec).sel_vector;
    iVar3 = 0;
    uVar4 = 0;
    do {
      if (uVar4 < matches->count) {
        uVar5 = uVar4;
        if (psVar1 != (sel_t *)0x0) {
          uVar5 = (ulong)psVar1[uVar4];
        }
        bVar6 = iVar3 == uVar5;
      }
      else {
        bVar6 = false;
      }
      if (bVar6 == false) {
        return iVar3;
      }
      uVar4 = uVar4 + bVar6;
      iVar3 = iVar3 + 1;
    } while (matches->size != iVar3);
  }
  return 0xffffffffffffffff;
}

Assistant:

idx_t LocateErrorIndex(bool is_append, const ManagedSelection &matches) {
	// We expected to find nothing, so the first error is the first match.
	if (!is_append) {
		return matches[0];
	}
	// We expected to find matches for all of them, so the first missing match is the first error.
	return FirstMissingMatch(matches);
}